

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  SDL_Window *window;
  void *sdl_gl_context;
  
  iVar1 = SDL_Init(0xf231);
  if (iVar1 == 0) {
    SDL_GL_SetAttribute(0x14,2);
    iVar1 = 1;
    SDL_GL_SetAttribute(0x15,1);
    SDL_GL_SetAttribute(0x11,3);
    SDL_GL_SetAttribute(0x12,3);
    SDL_GL_SetAttribute(5,1);
    SDL_GL_SetAttribute(6,0x18);
    SDL_GL_SetAttribute(7,8);
    window = (SDL_Window *)
             SDL_CreateWindow("ImGui Transfer Function Demo",0x2fff0000,0x2fff0000,win_width,
                              win_height,0x22);
    sdl_gl_context = (void *)SDL_GL_CreateContext(window);
    SDL_GL_SetSwapInterval(1);
    SDL_GL_MakeCurrent(window,sdl_gl_context);
    iVar2 = ogl_LoadFunctions();
    if (iVar2 == 0) {
      std::operator<<((ostream *)&std::cerr,"Failed to initialize OpenGL\n");
    }
    else {
      iVar1 = 0;
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      ImGui_ImplSDL2_InitForOpenGL(window,sdl_gl_context);
      ImGui_ImplOpenGL3_Init("#version 330 core");
      run_app(argc,argv,window);
      ImGui_ImplOpenGL3_Shutdown();
      ImGui_ImplSDL2_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      SDL_GL_DeleteContext(sdl_gl_context);
      SDL_DestroyWindow(window);
      SDL_Quit();
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to init SDL: ");
    pcVar4 = (char *)SDL_GetError();
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\n");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, const char **argv)
{
    if (SDL_Init(SDL_INIT_EVERYTHING) != 0) {
        std::cerr << "Failed to init SDL: " << SDL_GetError() << "\n";
        return -1;
    }

    const char *glsl_version = "#version 330 core";
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_FLAGS, SDL_GL_CONTEXT_FORWARD_COMPATIBLE_FLAG);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_CORE);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 3);
    SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 3);

    // Create window with graphics context
    SDL_GL_SetAttribute(SDL_GL_DOUBLEBUFFER, 1);
    SDL_GL_SetAttribute(SDL_GL_DEPTH_SIZE, 24);
    SDL_GL_SetAttribute(SDL_GL_STENCIL_SIZE, 8);

    SDL_Window *window = SDL_CreateWindow("ImGui Transfer Function Demo",
                                          SDL_WINDOWPOS_CENTERED,
                                          SDL_WINDOWPOS_CENTERED,
                                          win_width,
                                          win_height,
                                          SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE);

    SDL_GLContext gl_context = SDL_GL_CreateContext(window);
    SDL_GL_SetSwapInterval(1);
    SDL_GL_MakeCurrent(window, gl_context);

    if (ogl_LoadFunctions() == ogl_LOAD_FAILED) {
        std::cerr << "Failed to initialize OpenGL\n";
        return 1;
    }

    // Setup Dear ImGui context
    ImGui::CreateContext();

    // Setup Dear ImGui style
    ImGui::StyleColorsDark();

    // Setup Platform/Renderer bindings
    ImGui_ImplSDL2_InitForOpenGL(window, gl_context);
    ImGui_ImplOpenGL3_Init(glsl_version);

    run_app(argc, argv, window);

    ImGui_ImplOpenGL3_Shutdown();
    ImGui_ImplSDL2_Shutdown();
    ImGui::DestroyContext();

    SDL_GL_DeleteContext(gl_context);
    SDL_DestroyWindow(window);
    SDL_Quit();

    return 0;
}